

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O0

bool __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
AllocInPage(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
           Page *page,size_t bytes,ushort pdataCount,ushort xdataSize,Allocation **allocationOut)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint uVar5;
  BVIndex index_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  Allocation *this_00;
  undefined4 *puVar7;
  char *functionStart;
  BucketId bucket_1;
  BucketId bucket;
  AutoCriticalSection local_98;
  AutoCriticalSection autoLock;
  XDataAllocation xdata;
  char *address;
  BVIndex index;
  uint length;
  TrackAllocData local_68;
  Allocation *local_40;
  Allocation *allocation;
  Allocation **allocationOut_local;
  ushort xdataSize_local;
  size_t sStack_28;
  ushort pdataCount_local;
  size_t bytes_local;
  Page *page_local;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  pAVar6 = &this->auxiliaryAllocator->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  allocation = (Allocation *)allocationOut;
  allocationOut_local._4_2_ = xdataSize;
  allocationOut_local._6_2_ = pdataCount;
  sStack_28 = bytes;
  bytes_local = (size_t)page;
  page_local = (Page *)this;
  TrackAllocData::CreateTrackAllocData
            (&local_68,(type_info *)&Allocation::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
             ,0x23d);
  pAVar6 = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                     (pAVar6,&local_68);
  this_00 = (Allocation *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar6,true,0x3f6470);
  Allocation::Allocation(this_00);
  if (this_00 == (Allocation *)0x0) {
    this_local._7_1_ = 1;
  }
  else {
    local_40 = this_00;
    bVar3 = Math::IsPow2((int32)sStack_28);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                         ,0x243,"(Math::IsPow2((int32)bytes))","Math::IsPow2((int32)bytes)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    uVar5 = GetChunkSizeForBytes(this,sStack_28);
    index_00 = GetFreeIndexForPage(this,(Page *)bytes_local,sStack_28);
    if (index_00 == 0xffffffff) {
      CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
      this_local._7_1_ = 0;
    }
    else {
      functionStart = (char *)(*(long *)(bytes_local + 0x18) + (ulong)(index_00 << 7));
      XDataAllocation::XDataAllocation((XDataAllocation *)&autoLock);
      if (allocationOut_local._6_2_ != 0) {
        AutoCriticalSection::AutoCriticalSection(&local_98,&this->codePageAllocators->cs);
        bVar3 = ShouldBeInFullList(this,(Page *)bytes_local);
        if (bVar3) {
          DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Memory::CustomHeap::Allocation>
                    (this->auxiliaryAllocator,local_40);
          uVar1 = *(uint *)(bytes_local + 0x20);
          if ((DAT_01ec73ca & 1) != 0) {
            Output::Trace(CustomHeapPhase,L"Moving page from bucket %d to full list\n",(ulong)uVar1)
            ;
          }
          if ((*(byte *)bytes_local & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                               ,0x25a,"(!page->inFullList)","!page->inFullList");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
                    (this->buckets + (int)uVar1,(Page *)bytes_local,this->fullPages + (int)uVar1);
          *(undefined1 *)bytes_local = 1;
          this_local._7_1_ = 0;
          bVar3 = true;
        }
        else {
          bVar3 = CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                  ::AllocSecondary(this->codePageAllocators,*(void **)(bytes_local + 8),
                                   (ULONG_PTR)functionStart,sStack_28,allocationOut_local._6_2_,
                                   allocationOut_local._4_2_,(SecondaryAllocation *)&autoLock);
          if (bVar3) {
            bVar3 = false;
          }
          else {
            DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Memory::CustomHeap::Allocation>
                      (this->auxiliaryAllocator,local_40);
            this_local._7_1_ = 1;
            bVar3 = true;
          }
        }
        AutoCriticalSection::~AutoCriticalSection(&local_98);
        if (bVar3) goto LAB_008efab7;
      }
      local_40->field_0x28 = local_40->field_0x28 & 0xfe;
      local_40->field_0x28 = local_40->field_0x28 & 0xfd;
      (local_40->field_0).page = (Page *)bytes_local;
      local_40->size = sStack_28;
      local_40->address = functionStart;
      local_40->thunkAddress = 0;
      this->allocationsSinceLastCompact = sStack_28 + this->allocationsSinceLastCompact;
      this->freeObjectSize = this->freeObjectSize - sStack_28;
      BVar4 = BVUnitT<unsigned_long>::TestRange
                        ((BVUnitT<unsigned_long> *)(bytes_local + 0x10),index_00,uVar5);
      if (BVar4 == '\0') {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        this_local._7_1_ = 0;
      }
      else {
        BVar4 = BVUnitT<unsigned_long>::TestRange
                          ((BVUnitT<unsigned_long> *)(bytes_local + 0x10),index_00,uVar5);
        if (BVar4 == '\0') {
          CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
          this_local._7_1_ = 0;
        }
        else {
          BVUnitT<unsigned_long>::ClearRange
                    ((BVUnitT<unsigned_long> *)(bytes_local + 0x10),index_00,uVar5);
          if ((DAT_01ec73ca & 1) != 0) {
            Output::Trace(CustomHeapPhase,L"ChunkSize: %d, Index: %d, Free bit vector in page: ",
                          (ulong)uVar5,(ulong)index_00);
          }
          if ((DAT_01ec73ca & 1) != 0) {
            Output::Trace(CustomHeapPhase,L"\n");
          }
          bVar3 = ShouldBeInFullList(this,(Page *)bytes_local);
          if (bVar3) {
            uVar5 = *(uint *)(bytes_local + 0x20);
            if ((DAT_01ec73ca & 1) != 0) {
              Output::Trace(CustomHeapPhase,L"Moving page from bucket %d to full list\n",
                            (ulong)uVar5);
            }
            if ((*(byte *)bytes_local & 1) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                                 ,0x292,"(!page->inFullList)","!page->inFullList");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
                      (this->buckets + (int)uVar5,(Page *)bytes_local,this->fullPages + (int)uVar5);
            *(undefined1 *)bytes_local = 1;
          }
          (local_40->xdata).super_SecondaryAllocation.address = (BYTE *)autoLock.cs;
          (allocation->field_0).page = (Page *)local_40;
          this_local._7_1_ = 1;
        }
      }
    }
  }
LAB_008efab7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Heap<TAlloc, TPreReservedAlloc>::AllocInPage(Page* page, size_t bytes, ushort pdataCount, ushort xdataSize, Allocation ** allocationOut)
{
    Allocation * allocation = AnewNoThrowStruct(this->auxiliaryAllocator, Allocation);
    if (allocation == nullptr)
    {
        return true;
    }

    Assert(Math::IsPow2((int32)bytes));

    uint length = GetChunkSizeForBytes(bytes);
    BVIndex index = GetFreeIndexForPage(page, bytes);
    if (index == BVInvalidIndex)
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }
    char* address = page->address + Page::Alignment * index;

#if PDATA_ENABLED
    XDataAllocation xdata;
    if(pdataCount > 0)
    {
        AutoCriticalSection autoLock(&this->codePageAllocators->cs);
        if (this->ShouldBeInFullList(page))
        {
            Adelete(this->auxiliaryAllocator, allocation);
            // If we run out of XData space with the segment, move the page to the full page list, and return false to try the next page.
            BucketId bucket = page->currentBucket;
            VerboseHeapTrace(_u("Moving page from bucket %d to full list\n"), bucket);

            Assert(!page->inFullList);
            this->buckets[bucket].MoveElementTo(page, &this->fullPages[bucket]);
            page->inFullList = true;
            return false;
        }

        if (!this->codePageAllocators->AllocSecondary(page->segment, (ULONG_PTR)address, bytes, pdataCount, xdataSize, &xdata))
        {
            Adelete(this->auxiliaryAllocator, allocation);
            return true;
        }
    }
#endif

#if DBG
    allocation->isAllocationUsed = false;
    allocation->isNotExecutableBecauseOOM = false;
#endif

    allocation->page = page;
    allocation->size = bytes;
    allocation->address = address;
    allocation->thunkAddress = 0;

#if DBG_DUMP
    this->allocationsSinceLastCompact += bytes;
    this->freeObjectSize -= bytes;
#endif

    //Section of the Page should already be freed.
    if (!page->freeBitVector.TestRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    //Section of the Page should already be freed.
    if (!page->freeBitVector.TestRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    page->freeBitVector.ClearRange(index, length);
    VerboseHeapTrace(_u("ChunkSize: %d, Index: %d, Free bit vector in page: "), length, index);

#if VERBOSE_HEAP
    page->freeBitVector.DumpWord();
#endif
    VerboseHeapTrace(_u("\n"));

    if (this->ShouldBeInFullList(page))
    {
        BucketId bucket = page->currentBucket;
        VerboseHeapTrace(_u("Moving page from bucket %d to full list\n"), bucket);

        Assert(!page->inFullList);
        this->buckets[bucket].MoveElementTo(page, &this->fullPages[bucket]);
        page->inFullList = true;
    }

#if PDATA_ENABLED
    allocation->xdata = xdata;
#endif

    *allocationOut = allocation;
    return true;
}